

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEPlanet.cpp
# Opt level: O2

bool __thiscall test_CEPlanet::test_Planets(test_CEPlanet *this)

{
  undefined1 uVar1;
  
  (**(code **)(*(long *)this + 0x88))();
  (**(code **)(*(long *)this + 0x90))(this);
  (**(code **)(*(long *)this + 0x98))(this);
  (**(code **)(*(long *)this + 0xa0))(this);
  (**(code **)(*(long *)this + 0xa8))(this);
  (**(code **)(*(long *)this + 0xb0))(this);
  (**(code **)(*(long *)this + 0xb8))(this);
  (**(code **)(*(long *)this + 0xc0))(this);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  return (bool)uVar1;
}

Assistant:

bool test_CEPlanet::test_Planets(void)
{
    test_mercury();
    test_venus();
    test_earth();
    test_mars();
    test_jupiter();
    test_saturn();
    test_uranus();
    test_neptune();

    return pass();
}